

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O2

Vec_Int_t *
Amap_LibDeriveGatePerm_rec(Amap_Lib_t *pLib,Kit_DsdNtk_t *pNtk,int iLit,Amap_Nod_t *pNod)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int Entry;
  Kit_DsdObj_t *pKVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Kit_DsdObj_t *pKVar9;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar10;
  Amap_Nod_t *pNod_00;
  uint i;
  ulong uVar11;
  
  iVar2 = Abc_Lit2Var(iLit);
  pKVar6 = Kit_DsdNtkObj(pNtk,iVar2);
  if (pKVar6 == (Kit_DsdObj_t *)0x0) {
    pVVar7 = Vec_IntAlloc(1);
    Vec_IntPush(pVVar7,iLit);
    return pVVar7;
  }
  if (((uint)*pKVar6 & 0x1c0) == 0x140) {
    if (pNod->field_0x3 != '\x06') {
      return (Vec_Int_t *)0x0;
    }
    pVVar7 = Vec_IntAlloc(10);
    uVar1 = *(ushort *)(pKVar6 + 1);
    uVar3 = Abc_Lit2Var((int)pNod->iFan0);
    pVVar8 = Amap_LibDeriveGatePerm_rec(pLib,pNtk,(uint)uVar1,pLib->pNodes + uVar3);
    if (pVVar8 != (Vec_Int_t *)0x0) {
      iVar2 = pVVar8->nSize;
      for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
        iVar4 = Vec_IntEntry(pVVar8,iVar10);
        Vec_IntPush(pVVar7,iVar4);
      }
      Vec_IntFree(pVVar8);
      uVar1 = *(ushort *)&pKVar6[1].field_0x2;
      uVar3 = Abc_Lit2Var((int)pNod->iFan1);
      pVVar8 = Amap_LibDeriveGatePerm_rec(pLib,pNtk,(uint)uVar1,pLib->pNodes + uVar3);
      if (pVVar8 != (Vec_Int_t *)0x0) {
        iVar2 = pVVar8->nSize;
        for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
          iVar4 = Vec_IntEntry(pVVar8,iVar10);
          Vec_IntPush(pVVar7,iVar4);
        }
        Vec_IntFree(pVVar8);
        uVar1 = *(ushort *)(pKVar6 + 2);
        uVar3 = Abc_Lit2Var((int)pNod->iFan2);
        p_00 = Amap_LibDeriveGatePerm_rec(pLib,pNtk,(uint)uVar1,pLib->pNodes + uVar3);
        if (p_00 != (Vec_Int_t *)0x0) {
          iVar2 = p_00->nSize;
          for (iVar10 = 0; pVVar8 = pVVar7, iVar10 < iVar2; iVar10 = iVar10 + 1) {
            iVar4 = Vec_IntEntry(p_00,iVar10);
            Vec_IntPush(pVVar7,iVar4);
          }
          goto LAB_006f2a9f;
        }
      }
    }
  }
  else {
    if (pNod->field_0x3 == '\x06') {
      return (Vec_Int_t *)0x0;
    }
    pVVar7 = Amap_LibCollectFanins(pLib,pNod);
    uVar3 = pVVar7->nSize;
    if (uVar3 == (uint)*pKVar6 >> 0x1a) {
      pVVar8 = Vec_IntAlloc(10);
      p_00 = Vec_IntAlloc(10);
      for (uVar11 = (ulong)((uint)*pKVar6 >> 0x1a); 0 < (long)uVar11; uVar11 = uVar11 - 1) {
        uVar1 = *(ushort *)(&pKVar6->field_0x2 + uVar11 * 2);
        iVar2 = Abc_Lit2Var((uint)uVar1);
        pKVar9 = Kit_DsdNtkObj(pNtk,iVar2);
        if (pKVar9 == (Kit_DsdObj_t *)0x0) {
          Vec_IntPush(p_00,(uint)uVar1);
        }
        else {
          pKVar9->field_0x1 = pKVar9->field_0x1 & 0xfd;
        }
      }
      iVar2 = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (i = 0; i != uVar3; i = i + 1) {
        iVar10 = Vec_IntEntry(pVVar7,i);
        if (iVar10 != 0) {
          uVar5 = Abc_Lit2Var(iVar10);
          pNod_00 = pLib->pNodes + uVar5;
          uVar11 = (ulong)((uint)*pKVar6 >> 0x1a);
LAB_006f28ec:
          if (0 < (long)uVar11) {
            uVar1 = *(ushort *)(&pKVar6->field_0x2 + uVar11 * 2);
            iVar10 = Abc_Lit2Var((uint)uVar1);
            pKVar9 = Kit_DsdNtkObj(pNtk,iVar10);
            if ((pKVar9 == (Kit_DsdObj_t *)0x0) || (((uint)*pKVar9 >> 9 & 1) != 0))
            goto LAB_006f2961;
            uVar5 = (uint)*pKVar9 & 0x1c0;
            if (uVar5 == 0xc0) {
              if (pNod_00->field_0x3 == '\x04') goto LAB_006f29ad;
              goto LAB_006f2961;
            }
            if (uVar5 == 0x100) {
              if (pNod_00->field_0x3 != '\x05') goto LAB_006f2961;
            }
            else if ((uVar5 != 0x140) || (pNod_00->field_0x3 != '\x06')) goto LAB_006f2961;
LAB_006f29ad:
            p = Amap_LibDeriveGatePerm_rec(pLib,pNtk,uVar1 & 0xfffffffe,pNod_00);
            if (p != (Vec_Int_t *)0x0) {
              pKVar9->field_0x1 = pKVar9->field_0x1 | 2;
              iVar10 = p->nSize;
              for (iVar4 = 0; iVar4 < iVar10; iVar4 = iVar4 + 1) {
                Entry = Vec_IntEntry(p,iVar4);
                Vec_IntPush(pVVar8,Entry);
              }
              Vec_IntFree(p);
              goto LAB_006f29a2;
            }
            Vec_IntFree(pVVar7);
            Vec_IntFree(p_00);
            pVVar7 = pVVar8;
            goto LAB_006f2abc;
          }
          goto LAB_006f29a2;
        }
        if (p_00->nSize <= iVar2) {
          Vec_IntFree(pVVar8);
          Vec_IntFree(p_00);
          goto LAB_006f2abc;
        }
        iVar10 = Vec_IntEntry(p_00,iVar2);
        Vec_IntPush(pVVar8,iVar10);
        iVar2 = iVar2 + 1;
LAB_006f29a2:
      }
      if (iVar2 != p_00->nSize) {
        if (pVVar8 != (Vec_Int_t *)0x0) {
          free(pVVar8->pArray);
          free(pVVar8);
        }
        pVVar8 = (Vec_Int_t *)0x0;
      }
      Vec_IntFree(pVVar7);
LAB_006f2a9f:
      Vec_IntFree(p_00);
      return pVVar8;
    }
  }
LAB_006f2abc:
  Vec_IntFree(pVVar7);
  return (Vec_Int_t *)0x0;
LAB_006f2961:
  uVar11 = uVar11 - 1;
  goto LAB_006f28ec;
}

Assistant:

Vec_Int_t * Amap_LibDeriveGatePerm_rec( Amap_Lib_t * pLib, Kit_DsdNtk_t * pNtk, int iLit, Amap_Nod_t * pNod )
{
    Vec_Int_t * vPerm, * vPermFanin, * vNodFanin, * vDsdLits;
    Kit_DsdObj_t * pDsdObj, * pDsdFanin;
    Amap_Nod_t * pNodFanin;
    int iDsdFanin, iNodFanin, Value, iDsdLit, i, k, j;
//    assert( !Abc_LitIsCompl(iLit) );
    pDsdObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pDsdObj == NULL )
    {
        vPerm = Vec_IntAlloc( 1 );
        Vec_IntPush( vPerm, iLit );
        return vPerm;
    }
    if ( pDsdObj->Type == KIT_DSD_PRIME && pNod->Type == AMAP_OBJ_MUX )
    {
        vPerm = Vec_IntAlloc( 10 );

        iDsdFanin  = pDsdObj->pFans[0];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[1];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[2];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan2) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        return vPerm;
    }
    // return if wrong types
    if ( pDsdObj->Type == KIT_DSD_PRIME || pNod->Type == AMAP_OBJ_MUX )
        return NULL;
    // return if sizes do not agree
    vNodFanin = Amap_LibCollectFanins( pLib, pNod );
    if ( Vec_IntSize(vNodFanin) != (int)pDsdObj->nFans )
    {
        Vec_IntFree( vNodFanin );
        return NULL;
    }
    // match fanins of DSD with fanins of nodes
    // clean the mark and save variable literals
    vPerm = Vec_IntAlloc( 10 );
    vDsdLits = Vec_IntAlloc( 10 );
    Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
    {
        pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
        if ( pDsdFanin )
            pDsdFanin->fMark = 0;
        else
            Vec_IntPush( vDsdLits, iDsdFanin );
    }
    // match each fanins of the node
    iDsdLit = 0;
    Vec_IntForEachEntry( vNodFanin, iNodFanin, k )
    {
        if ( iNodFanin == 0 )
        {
            if ( iDsdLit >= Vec_IntSize(vDsdLits) )
            {
                Vec_IntFree( vPerm );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vNodFanin );
                return NULL;
            }
            iDsdFanin = Vec_IntEntry( vDsdLits, iDsdLit++ );
            Vec_IntPush( vPerm, iDsdFanin );
            continue;
        }
        // find a matching component
        pNodFanin = Amap_LibNod( pLib, Abc_Lit2Var(iNodFanin) );
        Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
        {
            pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
            if ( pDsdFanin == NULL )
                continue;
            if ( pDsdFanin->fMark == 1 )
                continue;
            if ( !((pDsdFanin->Type == KIT_DSD_AND && pNodFanin->Type == AMAP_OBJ_AND) ||
                   (pDsdFanin->Type == KIT_DSD_XOR && pNodFanin->Type == AMAP_OBJ_XOR) ||
                   (pDsdFanin->Type == KIT_DSD_PRIME && pNodFanin->Type == AMAP_OBJ_MUX)) )
                   continue;
            vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(iDsdFanin), pNodFanin );
            if ( vPermFanin == NULL )
            {
                Vec_IntFree( vNodFanin );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vPerm );
                return NULL;
            }
            pDsdFanin->fMark = 1;
            Vec_IntForEachEntry( vPermFanin, Value, j )
                Vec_IntPush( vPerm, Value );
            Vec_IntFree( vPermFanin );
            break;
        }
    }
//    assert( iDsdLit == Vec_IntSize(vDsdLits) );
    if ( iDsdLit != Vec_IntSize(vDsdLits) )
        Vec_IntFreeP( &vPerm );
    Vec_IntFree( vNodFanin );
    Vec_IntFree( vDsdLits );
    return vPerm;
}